

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int pixel_filter_helper(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int local_118;
  int singleHDU;
  int hdunum;
  int ii;
  char *DEFAULT_TAG;
  PixelFilter filter;
  int *status_local;
  char *expr_local;
  char *outfile_local;
  fitsfile **fptr_local;
  
  filter._208_8_ = status;
  memset(&DEFAULT_TAG,0,0xd8);
  _hdunum = "X";
  DEFAULT_TAG._0_4_ = 1;
  filter.path = (char **)&hdunum;
  filter.tag = (char **)fptr;
  iVar1 = ffinit((fitsfile **)&filter.blank,outfile,(int *)filter._208_8_);
  if (iVar1 < 1) {
    ffghdn(*fptr,&local_118);
    status_local = (int *)(expr + 3);
    switch((char)*status_local) {
    case 'B':
    case 'b':
      filter.expression._0_4_ = 8;
      break;
    case 'D':
    case 'd':
      filter.expression._0_4_ = -0x40;
      break;
    case 'I':
    case 'i':
      filter.expression._0_4_ = 0x10;
      break;
    case 'J':
    case 'j':
      filter.expression._0_4_ = 0x20;
      break;
    case 'R':
    case 'r':
      filter.expression._0_4_ = -0x20;
    }
    if ((int)filter.expression != 0) {
      status_local = (int *)(expr + 4);
    }
    bVar3 = (char)*status_local == '1';
    if (bVar3) {
      status_local = (int *)((long)status_local + 1);
    }
    bVar4 = (*fptr)->Fptr->only_one == 0;
    if ((char)*status_local != ' ') {
      ffpmsg("pixel filtering expression not space separated:");
      ffpmsg((char *)status_local);
    }
    for (; (char)*status_local == ' '; status_local = (int *)((long)status_local + 1)) {
    }
    for (singleHDU = 1; (bVar4 && !bVar3) && singleHDU < local_118; singleHDU = singleHDU + 1) {
      ffmahd(*fptr,singleHDU,(int *)0x0,(int *)filter._208_8_);
      iVar1 = ffcopy(*fptr,(fitsfile *)filter.blank,0,(int *)filter._208_8_);
      if (0 < iVar1) {
        ffclos((fitsfile *)filter.blank,(int *)filter._208_8_);
        return *(int *)filter._208_8_;
      }
    }
    ffmahd(*fptr,local_118,(int *)0x0,(int *)filter._208_8_);
    filter.ifptr = (fitsfile **)status_local;
    iVar2 = fits_pixel_filter((PixelFilter *)&DEFAULT_TAG,(int *)filter._208_8_);
    iVar1 = local_118;
    if (iVar2 == 0) {
      while ((singleHDU = iVar1 + 1, bVar4 && !bVar3 &&
             (iVar1 = ffmahd(*fptr,singleHDU,(int *)0x0,(int *)filter._208_8_), iVar1 < 1))) {
        ffcopy(*fptr,(fitsfile *)filter.blank,0,(int *)filter._208_8_);
        iVar1 = singleHDU;
      }
      if (*(int *)filter._208_8_ == 0x6b) {
        *(undefined4 *)filter._208_8_ = 0;
      }
      else if (0 < *(int *)filter._208_8_) {
        ffclos((fitsfile *)filter.blank,(int *)filter._208_8_);
        return *(int *)filter._208_8_;
      }
      ffclos(*fptr,(int *)filter._208_8_);
      *fptr = (fitsfile *)filter.blank;
      if (singleHDU + -1 != local_118) {
        ffmahd(*fptr,local_118,(int *)0x0,(int *)filter._208_8_);
      }
      fptr_local._4_4_ = *(int *)filter._208_8_;
    }
    else {
      ffpmsg("failed to execute image filter:");
      ffpmsg((char *)status_local);
      ffclos((fitsfile *)filter.blank,(int *)filter._208_8_);
      fptr_local._4_4_ = *(int *)filter._208_8_;
    }
  }
  else {
    ffpmsg("failed to create output file for pixel filter:");
    ffpmsg(outfile);
    fptr_local._4_4_ = *(int *)filter._208_8_;
  }
  return fptr_local._4_4_;
}

Assistant:

int pixel_filter_helper(
           fitsfile **fptr,  /* IO - pointer to input image; on output it  */
                             /*      points to the new image */
           char *outfile,    /* I - name for output file        */
           char *expr,       /* I - Image filter expression    */
           int *status)
{
	PixelFilter filter = { 0 };
	char * DEFAULT_TAG = "X";
	int ii, hdunum;
        int singleHDU = 0;

	filter.count = 1;
	filter.ifptr = fptr;
	filter.tag = &DEFAULT_TAG;

    /* create new empty file for result */
    if (ffinit(&filter.ofptr, outfile, status) > 0)
    {
        ffpmsg("failed to create output file for pixel filter:");
        ffpmsg(outfile);
        return(*status);
    }

    fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

    expr += 3; /* skip 'pix' */
    switch (expr[0]) {
       case 'b': 
       case 'B': filter.bitpix = BYTE_IMG; break;
       case 'i':
       case 'I': filter.bitpix = SHORT_IMG; break;
       case 'j':
       case 'J': filter.bitpix = LONG_IMG; break;
       case 'r':
       case 'R': filter.bitpix = FLOAT_IMG; break;
       case 'd':
       case 'D': filter.bitpix = DOUBLE_IMG; break;
    }
    if (filter.bitpix) /* skip bitpix indicator */
       ++expr;

    if (*expr == '1') {
       ++expr;
       singleHDU = 1;
    }

    if (((*fptr)->Fptr)->only_one)
       singleHDU = 1;

    if (*expr != ' ') {
       ffpmsg("pixel filtering expression not space separated:");
       ffpmsg(expr);
    }
    while (*expr == ' ')
       ++expr;

    /* copy all preceding extensions to the output file */
    for (ii = 1; !singleHDU && ii < hdunum; ii++)
    {
        fits_movabs_hdu(*fptr, ii, NULL, status);
        if (fits_copy_hdu(*fptr, filter.ofptr, 0, status) > 0)
        {
            ffclos(filter.ofptr, status);
            return(*status);
        }
    }

    /* move back to the original HDU position */
    fits_movabs_hdu(*fptr, hdunum, NULL, status);

	filter.expression = expr;
    if (fits_pixel_filter(&filter, status)) {
        ffpmsg("failed to execute image filter:");
        ffpmsg(expr);
        ffclos(filter.ofptr, status);
        return(*status);
    }


    /* copy any remaining HDUs to the output file */

    for (ii = hdunum + 1; !singleHDU; ii++)
    {
        if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

        fits_copy_hdu(*fptr, filter.ofptr, 0, status);
    }

    if (*status == END_OF_FILE)   
        *status = 0;              /* got the expected EOF error; reset = 0  */
    else if (*status > 0)
    {
        ffclos(filter.ofptr, status);
        return(*status);
    }

    /* close the original file and return ptr to the new image */
    ffclos(*fptr, status);

    *fptr = filter.ofptr; /* reset the pointer to the new table */

    /* move back to the image subsection */
    if (ii - 1 != hdunum)
        fits_movabs_hdu(*fptr, hdunum, NULL, status);

    return(*status);
}